

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

int h264_cabac_renorm(bitstream *str,h264_cabac_context *cabac)

{
  int iVar1;
  uint local_24;
  h264_cabac_context *phStack_20;
  uint32_t tmp;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  phStack_20 = cabac;
  cabac_local = (h264_cabac_context *)str;
  while( true ) {
    while( true ) {
      if (0xff < phStack_20->codIRange) {
        return 0;
      }
      phStack_20->codIRange = phStack_20->codIRange << 1;
      phStack_20->codIOffset = phStack_20->codIOffset << 1;
      if (*(int *)&cabac_local->slice != 0) break;
      if (phStack_20->codIOffset < 0x200) {
        iVar1 = put_bit((bitstream *)cabac_local,phStack_20,0);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else if (phStack_20->codIOffset < 0x400) {
        phStack_20->bitsOutstanding = phStack_20->bitsOutstanding + 1;
        phStack_20->codIOffset = phStack_20->codIOffset - 0x200;
      }
      else {
        iVar1 = put_bit((bitstream *)cabac_local,phStack_20,1);
        if (iVar1 != 0) {
          return 1;
        }
        phStack_20->codIOffset = phStack_20->codIOffset - 0x400;
      }
    }
    iVar1 = vs_u((bitstream *)cabac_local,&local_24,1);
    if (iVar1 != 0) break;
    phStack_20->codIOffset = local_24 | phStack_20->codIOffset;
  }
  return 1;
}

Assistant:

int h264_cabac_renorm(struct bitstream *str, struct h264_cabac_context *cabac) {
	while (cabac->codIRange < 256) {
		cabac->codIRange <<= 1;
		cabac->codIOffset <<= 1;
		if (str->dir == VS_ENCODE) {
			if (cabac->codIOffset < 512) {
				if (put_bit(str, cabac, 0))
					return 1;
			} else if (cabac->codIOffset >= 1024) {
				if (put_bit(str, cabac, 1))
					return 1;
				cabac->codIOffset -= 1024;
			} else {
				cabac->bitsOutstanding++;
				cabac->codIOffset -= 512;
			}
		} else {
			uint32_t tmp;
			if (vs_u(str, &tmp, 1))
				return 1;
			cabac->codIOffset |= tmp;
		}
	}
	return 0;
}